

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_IDAT(ucvector *out,uchar *data,size_t datasize,LodePNGCompressSettings *zlibsettings)

{
  size_t local_40;
  size_t zlibsize;
  uchar *zlib;
  LodePNGCompressSettings *pLStack_28;
  uint error;
  LodePNGCompressSettings *zlibsettings_local;
  size_t datasize_local;
  uchar *data_local;
  ucvector *out_local;
  
  zlib._4_4_ = 0;
  zlibsize = 0;
  local_40 = 0;
  pLStack_28 = zlibsettings;
  zlibsettings_local = (LodePNGCompressSettings *)datasize;
  datasize_local = (size_t)data;
  data_local = (uchar *)out;
  zlib._4_4_ = zlib_compress((uchar **)&zlibsize,&local_40,data,datasize,zlibsettings);
  if (zlib._4_4_ == 0) {
    zlib._4_4_ = lodepng_chunk_createv((ucvector *)data_local,local_40,"IDAT",(uchar *)zlibsize);
  }
  lodepng_free((void *)zlibsize);
  return zlib._4_4_;
}

Assistant:

static unsigned addChunk_IDAT(ucvector* out, const unsigned char* data, size_t datasize,
                              LodePNGCompressSettings* zlibsettings) {
  unsigned error = 0;
  unsigned char* zlib = 0;
  size_t zlibsize = 0;

  error = zlib_compress(&zlib, &zlibsize, data, datasize, zlibsettings);
  if(!error) {
    error = lodepng_chunk_createv(out, zlibsize, "IDAT", zlib);
  }
  lodepng_free(zlib);
  return error;
}